

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.cpp
# Opt level: O1

ObserveStatus __thiscall WFC::observe(WFC *this)

{
  uint uVar1;
  uint index;
  ulong uVar2;
  uint uVar3;
  ObserveStatus OVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double local_68;
  Array2D<unsigned_int> local_58;
  
  index = Wave::get_min_entropy(&this->wave,&this->gen);
  if (index == 0xfffffffe) {
    OVar4 = failure;
  }
  else if (index == 0xffffffff) {
    wave_to_output(&local_58,this);
    OVar4 = success;
    if (local_58.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.data.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.data.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      OVar4 = success;
    }
  }
  else {
    uVar7 = (ulong)index;
    if (this->nb_patterns == 0) {
      local_68 = 0.0;
    }
    else {
      local_68 = 0.0;
      uVar2 = 0;
      do {
        dVar8 = 0.0;
        if ((this->wave).data.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar2 + (this->wave).data.width * uVar7] !=
            '\0') {
          dVar8 = (this->patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar2];
        }
        local_68 = local_68 + dVar8;
        uVar2 = uVar2 + 1;
      } while ((uVar2 & 0xffffffff) < this->nb_patterns);
    }
    dVar8 = std::
            generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                      (&this->gen);
    uVar2 = this->nb_patterns;
    uVar6 = uVar2 - 1;
    if (uVar2 != 0) {
      dVar8 = dVar8 * local_68 + 0.0;
      uVar3 = 1;
      uVar5 = 0;
      do {
        dVar9 = 0.0;
        if ((this->wave).data.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar5 + (this->wave).data.width * uVar7] !=
            '\0') {
          dVar9 = (this->patterns_frequencies).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5];
        }
        dVar8 = dVar8 - dVar9;
        uVar6 = uVar5;
        if (dVar8 <= 0.0) break;
        uVar5 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
        uVar6 = uVar2 - 1;
      } while (uVar5 < uVar2);
    }
    OVar4 = to_continue;
    if (this->nb_patterns != 0) {
      uVar2 = 0;
      do {
        uVar3 = (uint)uVar2;
        if ((uVar6 != uVar2) ==
            ((this->wave).data.data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar2 + (this->wave).data.width * uVar7] != '\0')) {
          uVar1 = (this->wave).width;
          Propagator::add_to_propagator(&this->propagator,index / uVar1,index % uVar1,uVar3);
          Wave::set(&this->wave,index,uVar3,false);
        }
        uVar2 = (ulong)(uVar3 + 1);
      } while (uVar2 < this->nb_patterns);
      OVar4 = to_continue;
    }
  }
  return OVar4;
}

Assistant:

WFC::ObserveStatus WFC::observe() noexcept {
    // Get the cell with lowest entropy.
    int argmin = wave.get_min_entropy(gen);

    // If there is a contradiction, the algorithm has failed.
    if (argmin == -2) {
      return failure;
    }

    // If the lowest entropy is 0, then the algorithm has succeeded and
    // finished.
    if (argmin == -1) {
      wave_to_output();
      return success;
    }

    // Choose an element according to the pattern distribution
    double s = 0;
    for (unsigned k = 0; k < nb_patterns; k++) {
      s += wave.get(argmin, k) ? patterns_frequencies[k] : 0;
    }

    std::uniform_real_distribution<> dis(0, s);
    double random_value = dis(gen);
    size_t chosen_value = nb_patterns - 1;

    for (unsigned k = 0; k < nb_patterns; k++) {
      random_value -= wave.get(argmin, k) ? patterns_frequencies[k] : 0;
      if (random_value <= 0) {
        chosen_value = k;
        break;
      }
    }

    // And define the cell with the pattern.
    for (unsigned k = 0; k < nb_patterns; k++) {
      if (wave.get(argmin, k) != (k == chosen_value)) {
        propagator.add_to_propagator(argmin / wave.width, argmin % wave.width,
                                     k);
        wave.set(argmin, k, false);
      }
    }

    return to_continue;
  }